

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::SetActiveScriptContext_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  TTDSetActiveJsRTContext p_Var1;
  bool bVar2;
  JsRTVarsArgumentAction_InternalUse<1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *this;
  void *pvVar3;
  ScriptContext *local_48;
  ScriptContext *newCtx;
  GlobalObject *gobj;
  Var gvar;
  JsRTSingleVarArgumentAction *action;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)18>
                        (evt);
  origVar = GetVarItem_0<1ul>(argAction);
  this = (RecyclableObject *)InflateVarInReplay(executeContext,origVar);
  if (this != (RecyclableObject *)0x0) {
    bVar2 = Js::VarIs<Js::GlobalObject>(this);
    if (!bVar2) {
      TTDAbort_unrecoverable_error("Something is not right here!");
    }
  }
  if (this == (RecyclableObject *)0x0) {
    local_48 = (ScriptContext *)0x0;
  }
  else {
    local_48 = Js::RecyclableObject::GetScriptContext(this);
  }
  p_Var1 = (executeContext->TTDExternalObjectFunctions).pfSetActiveJsRTContext;
  pvVar3 = ThreadContextTTD::GetRuntimeHandle(executeContext);
  (*p_Var1)(pvVar3,local_48);
  return;
}

Assistant:

void SetActiveScriptContext_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::SetActiveScriptContextActionTag>(evt);
            Js::Var gvar = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTDAssert(gvar == nullptr || Js::VarIs<Js::GlobalObject>(gvar), "Something is not right here!");

            Js::GlobalObject* gobj = static_cast<Js::GlobalObject*>(gvar);
            Js::ScriptContext* newCtx = (gobj != nullptr) ? gobj->GetScriptContext() : nullptr;

            executeContext->TTDExternalObjectFunctions.pfSetActiveJsRTContext(executeContext->GetRuntimeHandle(), newCtx);
        }